

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

Reader __thiscall capnp::_::ListReader::asText(ListReader *this)

{
  StringPtr SVar1;
  uint uVar2;
  bool bVar3;
  Fault local_58;
  Fault f_2;
  char *cptr;
  Fault f_1;
  size_t size;
  Fault local_28;
  Fault f;
  ListReader *this_local;
  size_t sStack_10;
  
  bVar3 = false;
  if (this->structDataSize == 8) {
    bVar3 = this->structPointerCount == 0;
  }
  f.exception = (Exception *)this;
  if (bVar3) {
    uVar2 = unbound<unsigned_int>(this->elementCount);
    f_1.exception = (Exception *)(ulong)uVar2;
    if (f_1.exception == (Exception *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[50]>
                ((Fault *)&cptr,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0xc07,FAILED,"size > 0","\"Message contains text that is not NUL-terminated.\"",
                 (char (*) [50])"Message contains text that is not NUL-terminated.");
      this_local = (ListReader *)0x0;
      sStack_10 = 0;
      Text::Reader::Reader((Reader *)&this_local);
      kj::_::Debug::Fault::~Fault((Fault *)&cptr);
    }
    else {
      f_2.exception = (Exception *)this->ptr;
      f_1.exception = (Exception *)&f_1.exception[-1].field_0x157;
      if (*(char *)((long)f_1.exception + (long)((f_2.exception)->trace + -10)) == '\0') {
        Text::Reader::Reader((Reader *)&this_local,(char *)f_2.exception,(size_t)f_1.exception);
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[50]>
                  (&local_58,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0xc0e,FAILED,"cptr[size] == \'\\0\'",
                   "\"Message contains text that is not NUL-terminated.\"",
                   (char (*) [50])"Message contains text that is not NUL-terminated.");
        this_local = (ListReader *)0x0;
        sStack_10 = 0;
        Text::Reader::Reader((Reader *)&this_local);
        kj::_::Debug::Fault::~Fault(&local_58);
      }
    }
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0xc01,FAILED,
               "structDataSize == G(8) * BITS && structPointerCount == ZERO * POINTERS",
               "\"Expected Text, got list of non-bytes.\"",
               (char (*) [38])"Expected Text, got list of non-bytes.");
    this_local = (ListReader *)0x0;
    sStack_10 = 0;
    Text::Reader::Reader((Reader *)&this_local);
    kj::_::Debug::Fault::~Fault(&local_28);
  }
  SVar1.content.size_ = sStack_10;
  SVar1.content.ptr = (char *)this_local;
  return (StringPtr)(StringPtr)SVar1.content;
}

Assistant:

Text::Reader ListReader::asText() {
  KJ_REQUIRE(structDataSize == G(8) * BITS && structPointerCount == ZERO * POINTERS,
             "Expected Text, got list of non-bytes.") {
    return Text::Reader();
  }

  size_t size = unbound(elementCount / ELEMENTS);

  KJ_REQUIRE(size > 0, "Message contains text that is not NUL-terminated.") {
    return Text::Reader();
  }

  const char* cptr = reinterpret_cast<const char*>(ptr);
  --size;  // NUL terminator

  KJ_REQUIRE(cptr[size] == '\0', "Message contains text that is not NUL-terminated.") {
    return Text::Reader();
  }

  return Text::Reader(cptr, size);
}